

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::ByteData256::ByteData256(ByteData256 *this,string *hex)

{
  size_type sVar1;
  undefined8 uVar2;
  string *message;
  undefined1 *__n;
  CfdError error_code;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 uVar3;
  allocator in_stack_ffffffffffffff77;
  string local_88 [32];
  size_type local_68;
  CfdSourceLocation local_60;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vector;
  undefined1 local_19;
  string *hex_local;
  ByteData256 *this_local;
  
  __n = &local_19;
  message = (string *)this;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3e64c5);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),(size_type)__n,
             (allocator_type *)message);
  error_code = (CfdError)((ulong)__n >> 0x20);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3e64e8);
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,(string *)hex);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  if (sVar1 != 0x20) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_bytedata.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x107;
    local_60.funcname = "ByteData256";
    local_68 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    logger::warn<unsigned_long>(&local_60,"ByteData256 size unmatch. size={}.",&local_68);
    uVar3 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_88,"ByteData256 size unmatch.",(allocator *)&stack0xffffffffffffff77);
    CfdException::CfdException
              ((CfdException *)
               CONCAT17(in_stack_ffffffffffffff77,CONCAT16(uVar3,in_stack_ffffffffffffff70)),
               error_code,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->data_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)hex);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return;
}

Assistant:

ByteData256::ByteData256(const std::string& hex)
    : data_(std::vector<uint8_t>(kByteData256Length)) {
  std::vector<uint8_t> vector = StringUtil::StringToByte(hex);
  if (vector.size() != kByteData256Length) {
    warn(CFD_LOG_SOURCE, "ByteData256 size unmatch. size={}.", vector.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ByteData256 size unmatch.");
  }
  data_ = vector;
}